

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lincost.cc
# Opt level: O0

void __thiscall bsplib::LinCost::reset(LinCost *this,int nprocs)

{
  value_type_conflict local_20;
  int local_14;
  LinCost *pLStack_10;
  int nprocs_local;
  LinCost *this_local;
  
  this->m_nprocs = nprocs;
  local_14 = nprocs;
  pLStack_10 = this;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear(&this->m_sizes);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear(&this->m_counts);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&this->m_sizes,(long)(local_14 + 1));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&this->m_counts,(long)(local_14 + 1));
  local_20 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&this->m_sizes,&local_20);
  return;
}

Assistant:

void LinCost::reset(int nprocs)
{
    m_nprocs = nprocs;
    m_sizes.clear(); m_counts.clear();
    m_sizes.reserve( nprocs + 1);
    m_counts.reserve( nprocs + 1);
    m_sizes.push_back(0); // we insert 0 as an extra option
}